

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.h
# Opt level: O0

int av1_get_palette_mode_ctx(MACROBLOCKD *xd)

{
  int ctx;
  MB_MODE_INFO *left_mi;
  MB_MODE_INFO *above_mi;
  MACROBLOCKD *xd_local;
  
  ctx = 0;
  if (xd->above_mbmi != (MB_MODE_INFO *)0x0) {
    ctx = (int)((xd->above_mbmi->palette_mode_info).palette_size[0] != '\0');
  }
  if (xd->left_mbmi != (MB_MODE_INFO *)0x0) {
    ctx = (uint)((xd->left_mbmi->palette_mode_info).palette_size[0] != '\0') + ctx;
  }
  return ctx;
}

Assistant:

static inline int av1_get_palette_mode_ctx(const MACROBLOCKD *xd) {
  const MB_MODE_INFO *const above_mi = xd->above_mbmi;
  const MB_MODE_INFO *const left_mi = xd->left_mbmi;
  int ctx = 0;
  if (above_mi) ctx += (above_mi->palette_mode_info.palette_size[0] > 0);
  if (left_mi) ctx += (left_mi->palette_mode_info.palette_size[0] > 0);
  return ctx;
}